

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathCompOpEvalToBoolean(xmlXPathParserContextPtr ctxt,xmlXPathStepOpPtr op,int isPredicate)

{
  int iVar1;
  int local_34;
  xmlXPathObjectPtr pxStack_30;
  int res;
  xmlXPathObjectPtr resObj;
  xmlXPathStepOpPtr pxStack_20;
  int isPredicate_local;
  xmlXPathStepOpPtr op_local;
  xmlXPathParserContextPtr ctxt_local;
  
  pxStack_20 = op;
LAB_0026b6bb:
  if ((ctxt->context->opLimit != 0) && (iVar1 = xmlXPathCheckOpLimit(ctxt,1), iVar1 < 0)) {
    return 0;
  }
  switch(pxStack_20->op) {
  case XPATH_OP_END:
    return 0;
  default:
    xmlXPathCompOpEval(ctxt,pxStack_20);
    if (ctxt->error != 0) {
      return -1;
    }
    pxStack_30 = valuePop(ctxt);
    if (pxStack_30 == (xmlXPathObjectPtr)0x0) {
      return -1;
    }
    break;
  case XPATH_OP_COLLECT:
    if (pxStack_20->ch1 == -1) {
      return 0;
    }
    xmlXPathCompOpEval(ctxt,ctxt->comp->steps + pxStack_20->ch1);
    if (ctxt->error != 0) {
      return -1;
    }
    xmlXPathNodeCollectAndTest(ctxt,pxStack_20,(xmlNodePtr *)0x0,(xmlNodePtr *)0x0,1);
    if (ctxt->error != 0) {
      return -1;
    }
    pxStack_30 = valuePop(ctxt);
    if (pxStack_30 == (xmlXPathObjectPtr)0x0) {
      return -1;
    }
    break;
  case XPATH_OP_VALUE:
    if (isPredicate != 0) {
      iVar1 = xmlXPathEvaluatePredicateResult(ctxt,(xmlXPathObjectPtr)pxStack_20->value4);
      return iVar1;
    }
    iVar1 = xmlXPathCastToBoolean((xmlXPathObjectPtr)pxStack_20->value4);
    return iVar1;
  case XPATH_OP_SORT:
    goto switchD_0026b712_caseD_11;
  }
  if (pxStack_30 != (xmlXPathObjectPtr)0x0) {
    if (pxStack_30->type == XPATH_BOOLEAN) {
      local_34 = pxStack_30->boolval;
    }
    else if (isPredicate == 0) {
      local_34 = xmlXPathCastToBoolean(pxStack_30);
    }
    else {
      local_34 = xmlXPathEvaluatePredicateResult(ctxt,pxStack_30);
    }
    xmlXPathReleaseObject(ctxt->context,pxStack_30);
    return local_34;
  }
  return 0;
switchD_0026b712_caseD_11:
  if (pxStack_20->ch1 == -1) {
    return 0;
  }
  pxStack_20 = ctxt->comp->steps + pxStack_20->ch1;
  goto LAB_0026b6bb;
}

Assistant:

static int
xmlXPathCompOpEvalToBoolean(xmlXPathParserContextPtr ctxt,
			    xmlXPathStepOpPtr op,
			    int isPredicate)
{
    xmlXPathObjectPtr resObj = NULL;

start:
    if (OP_LIMIT_EXCEEDED(ctxt, 1))
        return(0);
    /* comp = ctxt->comp; */
    switch (op->op) {
        case XPATH_OP_END:
            return (0);
	case XPATH_OP_VALUE:
	    resObj = (xmlXPathObjectPtr) op->value4;
	    if (isPredicate)
		return(xmlXPathEvaluatePredicateResult(ctxt, resObj));
	    return(xmlXPathCastToBoolean(resObj));
	case XPATH_OP_SORT:
	    /*
	    * We don't need sorting for boolean results. Skip this one.
	    */
            if (op->ch1 != -1) {
		op = &ctxt->comp->steps[op->ch1];
		goto start;
	    }
	    return(0);
	case XPATH_OP_COLLECT:
	    if (op->ch1 == -1)
		return(0);

            xmlXPathCompOpEval(ctxt, &ctxt->comp->steps[op->ch1]);
	    if (ctxt->error != XPATH_EXPRESSION_OK)
		return(-1);

            xmlXPathNodeCollectAndTest(ctxt, op, NULL, NULL, 1);
	    if (ctxt->error != XPATH_EXPRESSION_OK)
		return(-1);

	    resObj = valuePop(ctxt);
	    if (resObj == NULL)
		return(-1);
	    break;
	default:
	    /*
	    * Fallback to call xmlXPathCompOpEval().
	    */
	    xmlXPathCompOpEval(ctxt, op);
	    if (ctxt->error != XPATH_EXPRESSION_OK)
		return(-1);

	    resObj = valuePop(ctxt);
	    if (resObj == NULL)
		return(-1);
	    break;
    }

    if (resObj) {
	int res;

	if (resObj->type == XPATH_BOOLEAN) {
	    res = resObj->boolval;
	} else if (isPredicate) {
	    /*
	    * For predicates a result of type "number" is handled
	    * differently:
	    * SPEC XPath 1.0:
	    * "If the result is a number, the result will be converted
	    *  to true if the number is equal to the context position
	    *  and will be converted to false otherwise;"
	    */
	    res = xmlXPathEvaluatePredicateResult(ctxt, resObj);
	} else {
	    res = xmlXPathCastToBoolean(resObj);
	}
	xmlXPathReleaseObject(ctxt->context, resObj);
	return(res);
    }

    return(0);
}